

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O3

int f_gc(lua_State *L)

{
  code *pcVar1;
  long *plVar2;
  void *pvVar3;
  lua_CFunction cf;
  
  plVar2 = (long *)luaL_checkudata(L,1,"FILE*");
  if ((plVar2[1] != 0) && (*plVar2 != 0)) {
    pvVar3 = luaL_checkudata(L,1,"FILE*");
    pcVar1 = *(code **)((long)pvVar3 + 8);
    *(undefined8 *)((long)pvVar3 + 8) = 0;
    (*pcVar1)(L);
  }
  return 0;
}

Assistant:

static int f_gc (lua_State *L) {
  LStream *p = tolstream(L);
  if (!isclosed(p) && p->f != NULL)
    aux_close(L);  /* ignore closed and incompletely open files */
  return 0;
}